

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O1

int TrellisQuantizeBlock
              (VP8Encoder *enc,int16_t *in,int16_t *out,int ctx0,int coeff_type,VP8Matrix *mtx,
              int lambda)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  uint16_t *puVar4;
  int iVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ushort uVar11;
  ushort uVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ulong *puVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  char cVar21;
  uint uVar22;
  ulong uVar23;
  ulong *puVar24;
  long lVar25;
  int iVar26;
  bool bVar27;
  ScoreState score_states [2] [2];
  Node nodes [16] [2];
  long local_198;
  int local_188;
  uint local_184;
  char *local_160;
  ulong local_100 [5];
  ulong local_d8 [4];
  char acStack_b8 [2];
  ushort auStack_b6 [67];
  
  bVar27 = coeff_type == 0;
  bVar1 = *(byte *)((long)(enc->proba_).coeffs_[(uint)coeff_type][0] +
                   (long)ctx0 * 0xb + (ulong)""[bVar27] * 0x20 + (ulong)""[bVar27]);
  uVar16 = (uint)mtx->q_[1] * (uint)mtx->q_[1] >> 2;
  uVar10 = (ulong)-(uint)!bVar27;
  uVar23 = 0xf;
  do {
    uVar18 = (uint)uVar23;
    uVar22 = (int)in[""[uVar23]] * (int)in[""[uVar23]];
    if (uVar16 < uVar22) {
      uVar10 = uVar23;
    }
  } while ((uVar22 <= uVar16) && (uVar23 = (ulong)(uVar18 - 1), bVar27 < uVar18));
  iVar15 = (int)uVar10;
  uVar12 = VP8EntropyCost[bVar1];
  lVar20 = (long)lambda;
  puVar4 = (enc->proba_).remapped_costs_[(uint)coeff_type][bVar27][ctx0];
  lVar19 = 8;
  do {
    if (ctx0 == 0) {
      uVar10 = (ulong)VP8EntropyCost[(byte)~bVar1];
    }
    else {
      uVar10 = 0;
    }
    *(ulong *)((long)local_100 + lVar19) = uVar10 * lVar20;
    *(uint16_t **)((long)local_100 + lVar19 + 8) = puVar4;
    lVar19 = lVar19 + 0x10;
  } while (lVar19 == 0x18);
  if ((int)((uint)(iVar15 < 0xf) + iVar15) < (int)(uint)bVar27) {
    cVar21 = -1;
    local_184 = 0xffffffff;
    local_188 = -1;
  }
  else {
    local_198 = (ulong)uVar12 * lVar20;
    local_160 = acStack_b8 + (ulong)(coeff_type == 0) * 8 + 2;
    cVar21 = -1;
    local_188 = -1;
    local_184 = 0xffffffff;
    puVar17 = local_100 + 1;
    uVar10 = (ulong)(coeff_type == 0);
    puVar24 = local_d8;
    do {
      puVar6 = puVar17;
      bVar1 = ""[uVar10];
      local_100[0] = (ulong)bVar1;
      uVar23 = (ulong)((uint)bVar1 * 2);
      uVar12 = *(ushort *)((long)mtx->q_ + uVar23);
      uVar3 = *(ushort *)((long)in + uVar23);
      uVar11 = -uVar3;
      if (0 < (short)uVar3) {
        uVar11 = uVar3;
      }
      iVar5 = (uint)*(ushort *)((long)mtx->sharpen_ + uVar23) + (uint)uVar11;
      uVar16 = (uint)*(ushort *)((long)mtx->iq_ + uVar23) * iVar5;
      uVar22 = uVar16 >> 0x11;
      uVar16 = uVar16 + 0x10000 >> 0x11;
      if (0x7fe < uVar16) {
        uVar16 = 0x7ff;
      }
      if (0x7fe < uVar22) {
        uVar22 = 0x7ff;
      }
      uVar23 = uVar10 + 1;
      bVar2 = ""[uVar10 + 1];
      iVar26 = uVar22 * uVar12;
      iVar5 = iVar26 + iVar5 * -2;
      lVar19 = 0;
      puVar17 = puVar24;
      do {
        uVar8 = (ulong)uVar22 + lVar19;
        uVar7 = 2;
        if ((uint)uVar8 < 2) {
          uVar7 = uVar8 & 0xffffffff;
        }
        puVar17[1] = (ulong)(enc->proba_).remapped_costs_[(uint)coeff_type][uVar10 + 1][uVar7];
        if (uVar16 < uVar8) {
          *puVar17 = 0x7fffffffffffff;
        }
        else {
          uVar11 = kWeightTrellis[bVar1];
          uVar13 = 0x43;
          if ((int)(uint)uVar8 < 0x43) {
            uVar13 = uVar8 & 0xffffffff;
          }
          uVar18 = (uint)*(ushort *)((long)VP8LevelFixedCosts + lVar19 * 2 + (ulong)(uVar22 * 2));
          lVar25 = (ulong)(*(ushort *)(puVar6[1] + uVar13 * 2) + uVar18) * lVar20 + *puVar6;
          lVar14 = (ulong)(*(ushort *)(puVar6[3] + uVar13 * 2) + uVar18) * lVar20 + puVar6[2];
          lVar9 = lVar14;
          if (lVar25 <= lVar14) {
            lVar9 = lVar25;
          }
          local_160[lVar19 * 4 + -2] = lVar14 < lVar25;
          uVar13 = lVar9 + (long)(int)(iVar5 * iVar26 * (uint)uVar11) * 0x100;
          local_160[lVar19 * 4 + -1] = (byte)(uVar3 >> 0xf);
          *(short *)(local_160 + lVar19 * 4) = (short)uVar8;
          *puVar17 = uVar13;
          if ((uVar8 != 0) && ((long)uVar13 < local_198)) {
            if (uVar10 < 0xf) {
              uVar8 = (ulong)VP8EntropyCost
                             [*(byte *)((long)(enc->proba_).coeffs_[(uint)coeff_type][0] +
                                       uVar7 * 0xb + (ulong)bVar2 * 0x20 + (ulong)bVar2)];
            }
            else {
              uVar8 = 0;
            }
            lVar9 = uVar8 * lVar20 + uVar13;
            if (lVar9 < local_198) {
              local_184 = (uint)uVar10;
              local_188 = (int)lVar19;
              local_198 = lVar9;
              cVar21 = lVar14 < lVar25;
            }
          }
        }
        lVar19 = lVar19 + 1;
        iVar5 = iVar5 + (uint)uVar12;
        puVar17 = puVar17 + 2;
        iVar26 = iVar26 + (uint)uVar12;
      } while (lVar19 == 1);
      local_160 = local_160 + 8;
      puVar17 = puVar24;
      uVar10 = uVar23;
      puVar24 = puVar6;
    } while (uVar23 != iVar15 + (uint)(iVar15 < 0xf) + 1);
  }
  if (coeff_type == 0) {
    in[8] = 0;
    in[9] = 0;
    in[10] = 0;
    in[0xb] = 0;
    in[0xc] = 0;
    in[0xd] = 0;
    in[0xe] = 0;
    in[0xf] = 0;
    in[1] = 0;
    in[2] = 0;
    in[3] = 0;
    in[4] = 0;
    in[5] = 0;
    in[6] = 0;
    in[7] = 0;
    in[8] = 0;
    out[8] = 0;
    out[9] = 0;
    out[10] = 0;
    out[0xb] = 0;
    out[0xc] = 0;
    out[0xd] = 0;
    out[0xe] = 0;
    out[0xf] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
    out[4] = 0;
    out[5] = 0;
    out[6] = 0;
    out[7] = 0;
    out[8] = 0;
  }
  else {
    in[8] = 0;
    in[9] = 0;
    in[10] = 0;
    in[0xb] = 0;
    in[0xc] = 0;
    in[0xd] = 0;
    in[0xe] = 0;
    in[0xf] = 0;
    in[0] = 0;
    in[1] = 0;
    in[2] = 0;
    in[3] = 0;
    in[4] = 0;
    in[5] = 0;
    in[6] = 0;
    in[7] = 0;
    out[8] = 0;
    out[9] = 0;
    out[10] = 0;
    out[0xb] = 0;
    out[0xc] = 0;
    out[0xd] = 0;
    out[0xe] = 0;
    out[0xf] = 0;
    out[0] = 0;
    out[1] = 0;
    out[2] = 0;
    out[3] = 0;
    out[4] = 0;
    out[5] = 0;
    out[6] = 0;
    out[7] = 0;
  }
  uVar16 = 0;
  if (local_184 != 0xffffffff) {
    acStack_b8[(long)local_188 * 4 + (long)(int)local_184 * 8] = cVar21;
    if ((int)(uint)bVar27 <= (int)local_184) {
      uVar10 = (ulong)local_184;
      iVar15 = local_184 + 1;
      uVar12 = 0;
      do {
        lVar19 = (long)local_188 * 4;
        bVar1 = ""[uVar10];
        uVar3 = *(ushort *)(acStack_b8 + uVar10 * 8 + lVar19 + 2);
        uVar11 = -uVar3;
        if (acStack_b8[uVar10 * 8 + lVar19 + 1] == '\0') {
          uVar11 = uVar3;
        }
        out[uVar10] = uVar11;
        uVar12 = uVar12 | uVar3;
        *(ushort *)((long)in + (ulong)((uint)bVar1 * 2)) =
             uVar11 * *(short *)((long)mtx->q_ + (ulong)((uint)bVar1 * 2));
        local_188 = (int)acStack_b8[uVar10 * 8 + lVar19];
        uVar10 = uVar10 - 1;
        iVar15 = iVar15 + -1;
      } while ((int)(uint)bVar27 < iVar15);
      uVar16 = (uint)(uVar12 != 0);
    }
  }
  return uVar16;
}

Assistant:

static int TrellisQuantizeBlock(const VP8Encoder* const enc,
                                int16_t in[16], int16_t out[16],
                                int ctx0, int coeff_type,
                                const VP8Matrix* const mtx,
                                int lambda) {
  const ProbaArray* const probas = enc->proba_.coeffs_[coeff_type];
  CostArrayPtr const costs =
      (CostArrayPtr)enc->proba_.remapped_costs_[coeff_type];
  const int first = (coeff_type == TYPE_I16_AC) ? 1 : 0;
  Node nodes[16][NUM_NODES];
  ScoreState score_states[2][NUM_NODES];
  ScoreState* ss_cur = &SCORE_STATE(0, MIN_DELTA);
  ScoreState* ss_prev = &SCORE_STATE(1, MIN_DELTA);
  int best_path[3] = {-1, -1, -1};   // store best-last/best-level/best-previous
  score_t best_score;
  int n, m, p, last;

  {
    score_t cost;
    const int thresh = mtx->q_[1] * mtx->q_[1] / 4;
    const int last_proba = probas[VP8EncBands[first]][ctx0][0];

    // compute the position of the last interesting coefficient
    last = first - 1;
    for (n = 15; n >= first; --n) {
      const int j = kZigzag[n];
      const int err = in[j] * in[j];
      if (err > thresh) {
        last = n;
        break;
      }
    }
    // we don't need to go inspect up to n = 16 coeffs. We can just go up
    // to last + 1 (inclusive) without losing much.
    if (last < 15) ++last;

    // compute 'skip' score. This is the max score one can do.
    cost = VP8BitCost(0, last_proba);
    best_score = RDScoreTrellis(lambda, cost, 0);

    // initialize source node.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      const score_t rate = (ctx0 == 0) ? VP8BitCost(1, last_proba) : 0;
      ss_cur[m].score = RDScoreTrellis(lambda, rate, 0);
      ss_cur[m].costs = costs[first][ctx0];
    }
  }

  // traverse trellis.
  for (n = first; n <= last; ++n) {
    const int j = kZigzag[n];
    const uint32_t Q  = mtx->q_[j];
    const uint32_t iQ = mtx->iq_[j];
    const uint32_t B = BIAS(0x00);     // neutral bias
    // note: it's important to take sign of the _original_ coeff,
    // so we don't have to consider level < 0 afterward.
    const int sign = (in[j] < 0);
    const uint32_t coeff0 = (sign ? -in[j] : in[j]) + mtx->sharpen_[j];
    int level0 = QUANTDIV(coeff0, iQ, B);
    int thresh_level = QUANTDIV(coeff0, iQ, BIAS(0x80));
    if (thresh_level > MAX_LEVEL) thresh_level = MAX_LEVEL;
    if (level0 > MAX_LEVEL) level0 = MAX_LEVEL;

    {   // Swap current and previous score states
      ScoreState* const tmp = ss_cur;
      ss_cur = ss_prev;
      ss_prev = tmp;
    }

    // test all alternate level values around level0.
    for (m = -MIN_DELTA; m <= MAX_DELTA; ++m) {
      Node* const cur = &NODE(n, m);
      const int level = level0 + m;
      const int ctx = (level > 2) ? 2 : level;
      const int band = VP8EncBands[n + 1];
      score_t base_score;
      score_t best_cur_score;
      int best_prev;
      score_t cost, score;

      ss_cur[m].costs = costs[n + 1][ctx];
      if (level < 0 || level > thresh_level) {
        ss_cur[m].score = MAX_COST;
        // Node is dead.
        continue;
      }

      {
        // Compute delta_error = how much coding this level will
        // subtract to max_error as distortion.
        // Here, distortion = sum of (|coeff_i| - level_i * Q_i)^2
        const int new_error = coeff0 - level * Q;
        const int delta_error =
            kWeightTrellis[j] * (new_error * new_error - coeff0 * coeff0);
        base_score = RDScoreTrellis(lambda, 0, delta_error);
      }

      // Inspect all possible non-dead predecessors. Retain only the best one.
      // The base_score is added to all scores so it is only added for the final
      // value after the loop.
      cost = VP8LevelCost(ss_prev[-MIN_DELTA].costs, level);
      best_cur_score =
          ss_prev[-MIN_DELTA].score + RDScoreTrellis(lambda, cost, 0);
      best_prev = -MIN_DELTA;
      for (p = -MIN_DELTA + 1; p <= MAX_DELTA; ++p) {
        // Dead nodes (with ss_prev[p].score >= MAX_COST) are automatically
        // eliminated since their score can't be better than the current best.
        cost = VP8LevelCost(ss_prev[p].costs, level);
        // Examine node assuming it's a non-terminal one.
        score = ss_prev[p].score + RDScoreTrellis(lambda, cost, 0);
        if (score < best_cur_score) {
          best_cur_score = score;
          best_prev = p;
        }
      }
      best_cur_score += base_score;
      // Store best finding in current node.
      cur->sign = sign;
      cur->level = level;
      cur->prev = best_prev;
      ss_cur[m].score = best_cur_score;

      // Now, record best terminal node (and thus best entry in the graph).
      if (level != 0 && best_cur_score < best_score) {
        const score_t last_pos_cost =
            (n < 15) ? VP8BitCost(0, probas[band][ctx][0]) : 0;
        const score_t last_pos_score = RDScoreTrellis(lambda, last_pos_cost, 0);
        score = best_cur_score + last_pos_score;
        if (score < best_score) {
          best_score = score;
          best_path[0] = n;                     // best eob position
          best_path[1] = m;                     // best node index
          best_path[2] = best_prev;             // best predecessor
        }
      }
    }
  }

  // Fresh start
  // Beware! We must preserve in[0]/out[0] value for TYPE_I16_AC case.
  if (coeff_type == TYPE_I16_AC) {
    memset(in + 1, 0, 15 * sizeof(*in));
    memset(out + 1, 0, 15 * sizeof(*out));
  } else {
    memset(in, 0, 16 * sizeof(*in));
    memset(out, 0, 16 * sizeof(*out));
  }
  if (best_path[0] == -1) {
    return 0;  // skip!
  }

  {
    // Unwind the best path.
    // Note: best-prev on terminal node is not necessarily equal to the
    // best_prev for non-terminal. So we patch best_path[2] in.
    int nz = 0;
    int best_node = best_path[1];
    n = best_path[0];
    NODE(n, best_node).prev = best_path[2];   // force best-prev for terminal

    for (; n >= first; --n) {
      const Node* const node = &NODE(n, best_node);
      const int j = kZigzag[n];
      out[n] = node->sign ? -node->level : node->level;
      nz |= node->level;
      in[j] = out[n] * mtx->q_[j];
      best_node = node->prev;
    }
    return (nz != 0);
  }
}